

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_istore_2(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value variableValue;
  ValueType VStack_2c;
  Value value;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  variableValue = Frame::popTopOfOperandStack(this_01);
  VStack_2c = variableValue.type;
  if (VStack_2c == INT) {
    Frame::changeLocalVariable(this_01,variableValue,2);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value.type == ValueType::INT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x520,"void ExecutionEngine::i_istore_2()");
}

Assistant:

void ExecutionEngine::i_istore_2() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value = topFrame->popTopOfOperandStack();
    assert(value.type == ValueType::INT);
    topFrame->changeLocalVariable(value, 2);

    topFrame->pc += 1;
}